

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcOrientedEdge::~IfcOrientedEdge(IfcOrientedEdge *this,void **vtt)

{
  void **vtt_local;
  IfcOrientedEdge *this_local;
  
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcEdge).field_0x40 = vtt[0x15];
  std::__cxx11::string::~string((string *)&this->Orientation);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL> *)
             &(this->super_IfcEdge).field_0x40,vtt + 0x10);
  IfcEdge::~IfcEdge(&this->super_IfcEdge,vtt + 1);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}